

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFEmitter.cpp
# Opt level: O1

void llvm::DWARFYAML::EmitDebugLoc(raw_ostream *OS,Data *DI)

{
  undefined4 uVar1;
  pointer pLVar2;
  undefined4 uVar3;
  uint uVar4;
  void *pvVar5;
  undefined1 *puVar6;
  uint64_t uVar7;
  uint uVar8;
  size_t __n;
  ulong Size;
  undefined1 *puVar9;
  pointer pLVar10;
  int local_68;
  int iStack_64;
  Loc Loc;
  undefined2 local_32;
  
  pLVar10 = (DI->Locs).
            super__Vector_base<llvm::DWARFYAML::Loc,_std::allocator<llvm::DWARFYAML::Loc>_>._M_impl.
            super__Vector_impl_data._M_start;
  pLVar2 = (DI->Locs).
           super__Vector_base<llvm::DWARFYAML::Loc,_std::allocator<llvm::DWARFYAML::Loc>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pLVar10 != pLVar2) {
    Loc.CompileUnitOffset = (uint64_t)DI;
    do {
      uVar7 = Loc.CompileUnitOffset;
      uVar1 = pLVar10->Start;
      uVar3 = pLVar10->End;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&Loc,&pLVar10->Location);
      Loc.Location.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)pLVar10->CompileUnitOffset;
      Size = (ulong)*(byte *)(*(long *)(uVar7 + 0x160) + 0x18);
      writeVariableSizedInteger((long)(int)uVar1,Size,OS,*(bool *)uVar7);
      writeVariableSizedInteger((long)(int)uVar3,Size,OS,*(bool *)uVar7);
      if ((uVar1 != -1) && (uVar3 != 0 || uVar1 != 0)) {
        uVar8 = (int)Loc.Location.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start - Loc.Start;
        uVar4 = CONCAT22((short)(uVar8 >> 0x10),(ushort)uVar8 << 8 | (ushort)uVar8 >> 8);
        if (*(char *)Loc.CompileUnitOffset != '\0') {
          uVar4 = uVar8;
        }
        __n = (size_t)uVar4;
        local_32 = (undefined2)uVar4;
        raw_ostream::write(OS,(int)&local_32,(void *)0x2,__n);
        puVar6 = (undefined1 *)
                 CONCAT44(Loc.Location.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start._4_4_,
                          (int)Loc.Location.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start);
        for (puVar9 = (undefined1 *)CONCAT44(Loc.End,Loc.Start); puVar9 != puVar6;
            puVar9 = puVar9 + 1) {
          local_32 = CONCAT11(local_32._1_1_,*puVar9);
          raw_ostream::write(OS,(int)&local_32,(void *)0x1,__n);
        }
      }
      pvVar5 = (void *)CONCAT44(Loc.End,Loc.Start);
      if (pvVar5 != (void *)0x0) {
        operator_delete(pvVar5,(long)Loc.Location.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar5);
      }
      pLVar10 = pLVar10 + 1;
    } while (pLVar10 != pLVar2);
  }
  return;
}

Assistant:

void DWARFYAML::EmitDebugLoc(raw_ostream &OS, const DWARFYAML::Data &DI) {
  for (auto Loc : DI.Locs) {
    auto AddrSize = DI.CompileUnits[0].AddrSize;  // XXX BINARYEN
    // FIXME: Loc.Start etc should probably not be 32-bit.
    writeVariableSizedInteger((uint64_t)(int32_t)Loc.Start, AddrSize, OS, DI.IsLittleEndian);
    writeVariableSizedInteger((uint64_t)(int32_t)Loc.End, AddrSize, OS, DI.IsLittleEndian);
    if (Loc.Start == 0 && Loc.End == 0) {
      // End of a list.
      continue;
    }
    if (Loc.Start != -1) {
      writeInteger((uint16_t)Loc.Location.size(), OS, DI.IsLittleEndian);
      for (auto x : Loc.Location) {
        writeInteger((uint8_t)x, OS, DI.IsLittleEndian);
      }
    }
  }
}